

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O0

Own<kj::ReadableDirectory,_std::nullptr_t> __thiscall
kj::newDiskReadableDirectory(kj *this,OwnFd *fd)

{
  OwnFd *params;
  ReadableDirectory *extraout_RDX;
  Own<kj::ReadableDirectory,_std::nullptr_t> OVar1;
  OwnFd *local_18;
  OwnFd *fd_local;
  
  local_18 = fd;
  fd_local = (OwnFd *)this;
  params = mv<kj::OwnFd>(fd);
  heap<kj::(anonymous_namespace)::DiskReadableDirectory,kj::OwnFd>
            ((kj *)&stack0xffffffffffffffd8,params);
  Own<kj::ReadableDirectory,decltype(nullptr)>::
  Own<kj::(anonymous_namespace)::DiskReadableDirectory,void>
            ((Own<kj::ReadableDirectory,decltype(nullptr)> *)this,
             (Own<kj::(anonymous_namespace)::DiskReadableDirectory,_std::nullptr_t> *)
             &stack0xffffffffffffffd8);
  Own<kj::(anonymous_namespace)::DiskReadableDirectory,_std::nullptr_t>::~Own
            ((Own<kj::(anonymous_namespace)::DiskReadableDirectory,_std::nullptr_t> *)
             &stack0xffffffffffffffd8);
  OVar1.ptr = extraout_RDX;
  OVar1.disposer = (Disposer *)this;
  return OVar1;
}

Assistant:

Own<ReadableDirectory> newDiskReadableDirectory(kj::OwnFd fd) {
  return heap<DiskReadableDirectory>(kj::mv(fd));
}